

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knote.c
# Opt level: O1

int knote_enable(filter *filt,knote *kn)

{
  unsigned_short *puVar1;
  int iVar2;
  
  iVar2 = 0;
  if ((((kn->kev).flags & 8) != 0) && (iVar2 = (*filt->kn_enable)(filt,kn), iVar2 == 0)) {
    puVar1 = &(kn->kev).flags;
    *(byte *)puVar1 = (byte)*puVar1 & 0xf7;
  }
  return iVar2;
}

Assistant:

int
knote_enable(struct filter *filt, struct knote *kn)
{
    int rv = 0;

    /* If the knote is already enabled, this call is a noop */
    if (KNOTE_ENABLED(kn))
        return (0);

    dbg_printf("kn=%p - calling kn_enable", kn);
    rv = filt->kn_enable(filt, kn);
    dbg_printf("kn=%p - kn_enable rv=%i", kn, rv);
    if (rv == 0) KNOTE_ENABLE(kn);
    return (rv);
}